

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::TPZDohrPrecond
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this)

{
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrPrecond_018179f8;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fGlobal;
  (this->fGlobal).
  super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->fCoarse = (TPZStepSolver<long_double> *)0x0;
  this->fNumCoarse = -1;
  this->fNumThreads = -1;
  TPZAutoPointer<TPZDohrAssembly<long_double>_>::TPZAutoPointer(&this->fAssemble);
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::~TPZDohrPrecond()
{
	if (fCoarse)
	{
		delete fCoarse;
		fCoarse = 0;
	}
}